

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O0

void ImageDraw(Image *dst,Image src,Rectangle srcRec,Rectangle dstRec,Color tint)

{
  ulong uVar1;
  Image image;
  Rectangle rec;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Color dst_00;
  undefined8 in_stack_ffffffffffffff10;
  int local_d4;
  void *pvStack_d0;
  int x;
  uchar *pDst;
  uchar *pSrc;
  void *pvStack_b8;
  int y;
  uchar *pDstBase;
  uchar *pSrcBase;
  int bytesPerPixelSrc;
  int strideSrc;
  int bytesPerPixelDst;
  int strideDst;
  _Bool blendRequired;
  Color blend;
  Color colDst;
  Color colSrc;
  undefined1 local_78 [31];
  byte local_59;
  Image *pIStack_58;
  _Bool useSrcMod;
  Image *srcPtr;
  Image srcMod;
  Image *dst_local;
  float fStack_28;
  Color tint_local;
  Rectangle dstRec_local;
  Rectangle srcRec_local;
  
  dstRec_local.width = srcRec.x;
  dstRec_local.height = srcRec.y;
  srcRec_local.x = srcRec.width;
  srcRec_local.y = srcRec.height;
  uVar1 = dstRec._0_8_;
  if ((((dst->data != (void *)0x0) && (dst->width != 0)) && (dst->height != 0)) &&
     (((src.data != (void *)0x0 && (src.width != 0)) && (src.height != 0)))) {
    srcMod._16_8_ = dst;
    if (1 < dst->mipmaps) {
      TraceLog(4,"Image drawing only applied to base mipmap level");
    }
    if (*(int *)(srcMod._16_8_ + 0x14) < 0xb) {
      memset(&srcPtr,0,0x18);
      local_59 = 0;
      if (dstRec_local.width < 0.0) {
        srcRec_local.x = dstRec_local.width + srcRec_local.x;
        dstRec_local.width = 0.0;
      }
      if (dstRec_local.height < 0.0) {
        srcRec_local.y = dstRec_local.height + srcRec_local.y;
        dstRec_local.height = 0.0;
      }
      if ((float)src.width < dstRec_local.width + srcRec_local.x) {
        srcRec_local.x = (float)src.width - dstRec_local.width;
      }
      if ((float)src.height < dstRec_local.height + srcRec_local.y) {
        srcRec_local.y = (float)src.height - dstRec_local.height;
      }
      dstRec_local.x = dstRec.width;
      dstRec_local.y = dstRec.height;
      pIStack_58 = &src;
      if (((int)srcRec_local.x != (int)dstRec_local.x) ||
         ((int)srcRec_local.y != (int)dstRec_local.y)) {
        rec.y = dstRec_local.height;
        rec.x = dstRec_local.width;
        rec.width = srcRec_local.x;
        rec.height = srcRec_local.y;
        ImageFromImage((Image *)local_78,src,rec);
        srcPtr = (Image *)local_78._0_8_;
        srcMod.data = (void *)local_78._8_8_;
        srcMod.width = local_78._16_4_;
        srcMod.height = local_78._20_4_;
        ImageResize((Image *)&srcPtr,(int)dstRec_local.x,(int)dstRec_local.y);
        srcRec_local.x = (float)(int)srcMod.data;
        srcRec_local.y = (float)srcMod.data._4_4_;
        dstRec_local.width = 0.0;
        dstRec_local.height = 0.0;
        pIStack_58 = (Image *)&srcPtr;
        local_59 = 1;
      }
      fStack_28 = dstRec.x;
      if (0.0 <= fStack_28) {
        if ((float)*(int *)(srcMod._16_8_ + 8) < fStack_28 + srcRec_local.x) {
          srcRec_local.x = (float)*(int *)(srcMod._16_8_ + 8) - fStack_28;
        }
      }
      else {
        dstRec_local.width = -fStack_28;
        srcRec_local.x = fStack_28 + srcRec_local.x;
        _fStack_28 = uVar1 & 0xffffffff00000000;
        uVar1 = _fStack_28;
      }
      _fStack_28 = uVar1;
      if (0.0 <= (float)tint_local) {
        if ((float)*(int *)(srcMod._16_8_ + 0xc) < (float)tint_local + srcRec_local.y) {
          srcRec_local.y = (float)*(int *)(srcMod._16_8_ + 0xc) - (float)tint_local;
        }
      }
      else {
        dstRec_local.height = -(float)tint_local;
        srcRec_local.y = (float)tint_local + srcRec_local.y;
        _fStack_28 = _fStack_28 & 0xffffffff;
      }
      if ((float)*(int *)(srcMod._16_8_ + 8) < srcRec_local.x) {
        srcRec_local.x = (float)*(int *)(srcMod._16_8_ + 8);
      }
      if ((float)*(int *)(srcMod._16_8_ + 0xc) < srcRec_local.y) {
        srcRec_local.y = (float)*(int *)(srcMod._16_8_ + 0xc);
      }
      bVar2 = true;
      dst_local._7_1_ = tint.a;
      if ((dst_local._7_1_ == 0xff) &&
         (((pIStack_58->format == 1 || (pIStack_58->format == 4)) || (pIStack_58->format == 3)))) {
        bVar2 = false;
      }
      iVar3 = GetPixelDataSize(*(int *)(srcMod._16_8_ + 8),1,*(int *)(srcMod._16_8_ + 0x14));
      iVar4 = iVar3 / *(int *)(srcMod._16_8_ + 8);
      iVar5 = GetPixelDataSize(pIStack_58->width,1,pIStack_58->format);
      iVar6 = iVar5 / pIStack_58->width;
      pDstBase = (uchar *)((long)pIStack_58->data +
                          (long)(((int)dstRec_local.height * pIStack_58->width +
                                 (int)dstRec_local.width) * iVar6));
      pvStack_b8 = (void *)(*(long *)srcMod._16_8_ +
                           (long)(((int)(float)tint_local * *(int *)(srcMod._16_8_ + 8) +
                                  (int)fStack_28) * iVar4));
      for (pSrc._4_4_ = 0; pSrc._4_4_ < (int)srcRec_local.y; pSrc._4_4_ = pSrc._4_4_ + 1) {
        pDst = pDstBase;
        pvStack_d0 = pvStack_b8;
        if ((bVar2) || (pIStack_58->format != *(int *)(srcMod._16_8_ + 0x14))) {
          for (local_d4 = 0; local_d4 < (int)srcRec_local.x; local_d4 = local_d4 + 1) {
            strideDst = (int)GetPixelColor(pDst,pIStack_58->format);
            dst_00 = GetPixelColor(pvStack_d0,*(int *)(srcMod._16_8_ + 0x14));
            if (bVar2) {
              strideDst = (int)ColorAlphaBlend(dst_00,(Color)strideDst,tint);
            }
            SetPixelColor(pvStack_d0,(Color)strideDst,*(int *)(srcMod._16_8_ + 0x14));
            pvStack_d0 = (void *)((long)pvStack_d0 + (long)iVar4);
            pDst = pDst + iVar6;
          }
        }
        else {
          memcpy(pvStack_b8,pDstBase,(long)((int)srcRec_local.x * iVar6));
        }
        pDstBase = pDstBase + iVar5;
        pvStack_b8 = (void *)((long)pvStack_b8 + (long)iVar3);
      }
      if ((local_59 & 1) != 0) {
        image.width = srcMod.width;
        image.height = srcMod.height;
        image.data = srcMod.data;
        image.mipmaps = (int)in_stack_ffffffffffffff10;
        image.format = (int)((ulong)in_stack_ffffffffffffff10 >> 0x20);
        UnloadImage(image);
      }
    }
    else {
      TraceLog(4,"Image drawing not supported for compressed formats");
    }
  }
  return;
}

Assistant:

void ImageDraw(Image *dst, Image src, Rectangle srcRec, Rectangle dstRec, Color tint)
{
    // Security check to avoid program crash
    if ((dst->data == NULL) || (dst->width == 0) || (dst->height == 0) ||
        (src.data == NULL) || (src.width == 0) || (src.height == 0)) return;

    if (dst->mipmaps > 1) TRACELOG(LOG_WARNING, "Image drawing only applied to base mipmap level");
    if (dst->format >= PIXELFORMAT_COMPRESSED_DXT1_RGB) TRACELOG(LOG_WARNING, "Image drawing not supported for compressed formats");
    else
    {
        Image srcMod = { 0 };       // Source copy (in case it was required)
        Image *srcPtr = &src;       // Pointer to source image
        bool useSrcMod = false;     // Track source copy required

        // Source rectangle out-of-bounds security checks
        if (srcRec.x < 0) { srcRec.width += srcRec.x; srcRec.x = 0; }
        if (srcRec.y < 0) { srcRec.height += srcRec.y; srcRec.y = 0; }
        if ((srcRec.x + srcRec.width) > src.width) srcRec.width = src.width - srcRec.x;
        if ((srcRec.y + srcRec.height) > src.height) srcRec.height = src.height - srcRec.y;

        // Check if source rectangle needs to be resized to destination rectangle
        // In that case, we make a copy of source and we apply all required transform
        if (((int)srcRec.width != (int)dstRec.width) || ((int)srcRec.height != (int)dstRec.height))
        {
            srcMod = ImageFromImage(src, srcRec);   // Create image from another image
            ImageResize(&srcMod, (int)dstRec.width, (int)dstRec.height);   // Resize to destination rectangle
            srcRec = (Rectangle){ 0, 0, (float)srcMod.width, (float)srcMod.height };

            srcPtr = &srcMod;
            useSrcMod = true;
        }

        // Destination rectangle out-of-bounds security checks
        if (dstRec.x < 0)
        {
            srcRec.x = -dstRec.x;
            srcRec.width += dstRec.x;
            dstRec.x = 0;
        }
        else if ((dstRec.x + srcRec.width) > dst->width) srcRec.width = dst->width - dstRec.x;

        if (dstRec.y < 0)
        {
            srcRec.y = -dstRec.y;
            srcRec.height += dstRec.y;
            dstRec.y = 0;
        }
        else if ((dstRec.y + srcRec.height) > dst->height) srcRec.height = dst->height - dstRec.y;

        if (dst->width < srcRec.width) srcRec.width = (float)dst->width;
        if (dst->height < srcRec.height) srcRec.height = (float)dst->height;

        // This blitting method is quite fast! The process followed is:
        // for every pixel -> [get_src_format/get_dst_format -> blend -> format_to_dst]
        // Some optimization ideas:
        //    [x] Avoid creating source copy if not required (no resize required)
        //    [x] Optimize ImageResize() for pixel format (alternative: ImageResizeNN())
        //    [x] Optimize ColorAlphaBlend() to avoid processing (alpha = 0) and (alpha = 1)
        //    [x] Optimize ColorAlphaBlend() for faster operations (maybe avoiding divs?)
        //    [x] Consider fast path: no alpha blending required cases (src has no alpha)
        //    [x] Consider fast path: same src/dst format with no alpha -> direct line copy
        //    [-] GetPixelColor(): Return Vector4 instead of Color, easier for ColorAlphaBlend()

        Color colSrc, colDst, blend;
        bool blendRequired = true;

        // Fast path: Avoid blend if source has no alpha to blend
        if ((tint.a == 255) && ((srcPtr->format == PIXELFORMAT_UNCOMPRESSED_GRAYSCALE) || (srcPtr->format == PIXELFORMAT_UNCOMPRESSED_R8G8B8) || (srcPtr->format == PIXELFORMAT_UNCOMPRESSED_R5G6B5))) blendRequired = false;

        int strideDst = GetPixelDataSize(dst->width, 1, dst->format);
        int bytesPerPixelDst = strideDst/(dst->width);

        int strideSrc = GetPixelDataSize(srcPtr->width, 1, srcPtr->format);
        int bytesPerPixelSrc = strideSrc/(srcPtr->width);

        unsigned char *pSrcBase = (unsigned char *)srcPtr->data + ((int)srcRec.y*srcPtr->width + (int)srcRec.x)*bytesPerPixelSrc;
        unsigned char *pDstBase = (unsigned char *)dst->data + ((int)dstRec.y*dst->width + (int)dstRec.x)*bytesPerPixelDst;

        for (int y = 0; y < (int)srcRec.height; y++)
        {
            unsigned char *pSrc = pSrcBase;
            unsigned char *pDst = pDstBase;

            // Fast path: Avoid moving pixel by pixel if no blend required and same format
            if (!blendRequired && (srcPtr->format == dst->format)) memcpy(pDst, pSrc, (int)(srcRec.width)*bytesPerPixelSrc);
            else
            {
                for (int x = 0; x < (int)srcRec.width; x++)
                {
                    colSrc = GetPixelColor(pSrc, srcPtr->format);
                    colDst = GetPixelColor(pDst, dst->format);

                    // Fast path: Avoid blend if source has no alpha to blend
                    if (blendRequired) blend = ColorAlphaBlend(colDst, colSrc, tint);
                    else blend = colSrc;

                    SetPixelColor(pDst, blend, dst->format);

                    pDst += bytesPerPixelDst;
                    pSrc += bytesPerPixelSrc;
                }
            }

            pSrcBase += strideSrc;
            pDstBase += strideDst;
        }

        if (useSrcMod) UnloadImage(srcMod);     // Unload source modified image
    }
}